

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::PrimitiveGen
          (DrawIndirectBase *this,GLenum primitiveType,uint drawSizeX,uint drawSizeY,
          CColorArray *output)

{
  runtime_error *this_00;
  CColorArray *output_local;
  uint drawSizeY_local;
  uint drawSizeX_local;
  GLenum primitiveType_local;
  DrawIndirectBase *this_local;
  
  switch(primitiveType) {
  case 0:
    PointsGen(this,drawSizeX,drawSizeY,output);
    break;
  case 1:
  case 2:
  case 3:
    LinesGen(this,drawSizeX,drawSizeY,output);
    break;
  case 4:
  case 5:
  case 6:
    TrianglesGen(this,drawSizeX,drawSizeY,output);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown primitive type!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 10:
    LinesAdjacencyGen(this,drawSizeX,drawSizeY,output);
    break;
  case 0xb:
    LineStripAdjacencyGen(this,drawSizeX,drawSizeY,output);
    break;
  case 0xc:
    TrianglesAdjacencyGen(this,drawSizeX,drawSizeY,output);
    break;
  case 0xd:
    TriangleStripAdjacencyGen(this,drawSizeX,drawSizeY,output);
  }
  return;
}

Assistant:

void PrimitiveGen(GLenum primitiveType, unsigned int drawSizeX, unsigned int drawSizeY, CColorArray& output)
	{
		switch (primitiveType)
		{
		case GL_POINTS:
			PointsGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES:
		case GL_LINE_STRIP:
		case GL_LINE_LOOP:
			LinesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES_ADJACENCY:
			LinesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINE_STRIP_ADJACENCY:
			LineStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES:
		case GL_TRIANGLE_STRIP:
		case GL_TRIANGLE_FAN:
			TrianglesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES_ADJACENCY:
			TrianglesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLE_STRIP_ADJACENCY:
			TriangleStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		default:
			throw std::runtime_error("Unknown primitive type!");
			break;
		}
	}